

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_strtou64(string *str,uint64 *value)

{
  bool bVar1;
  string local_38;
  unsigned_long *local_18;
  uint64 *value_local;
  string *str_local;
  
  local_18 = value;
  value_local = (uint64 *)str;
  std::__cxx11::string::string((string *)&local_38,(string *)str);
  bVar1 = safe_uint_internal<unsigned_long>(&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool safe_strtou64(const string& str, uint64* value) {
  return safe_uint_internal(str, value);
}